

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

void __thiscall dgrminer::PartialUnion::printEncoding(PartialUnion *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  _Self __tmp;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LABELING:",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  p_Var6 = (this->labelEncoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    p_Var2 = &(this->antecedentLabelsOfLabels)._M_t._M_impl.super__Rb_tree_header;
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,p_Var6[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (OLD: ",7);
      p_Var7 = (this->antecedentLabelsOfLabels)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var8 = p_Var2;
      if (p_Var7 != (_Base_ptr)0x0) {
        _Var3 = p_Var6[2]._M_color;
        p_Var5 = &p_Var2->_M_header;
        do {
          if ((int)_Var3 <= (int)*(size_t *)(p_Var7 + 1)) {
            p_Var5 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < (int)_Var3];
        } while (p_Var7 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
           (p_Var8 = (_Rb_tree_header *)p_Var5,
           (int)_Var3 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var8 = p_Var2;
        }
      }
      poVar4 = (ostream *)
               std::ostream::operator<<(poVar4,*(int *)((long)&p_Var8->_M_node_count + 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  return;
}

Assistant:

void PartialUnion::printEncoding()
	{
		cout << "LABELING:" << endl;
		std::map<std::string, int>::iterator i;
		for (i = labelEncoding.begin(); i != labelEncoding.end(); i++)
		{
			std::cout << i->first << " " << i->second << " (OLD: " << antecedentLabelsOfLabels.find(i->second)->second << ")" << std::endl;
		}
	}